

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_unsubscribe(subscription_s *s)

{
  fio_lock_i *pfVar1;
  uintptr_t *puVar2;
  size_t *psVar3;
  fio_lock_i fVar4;
  channel_s *pcVar5;
  subscription_s *psVar6;
  anon_struct_264_5_f7cd9697 *set;
  channel_s *__ptr;
  fio_ch_set__ordered_s_ *pfVar7;
  fio_match_fn p_Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [24];
  undefined1 auVar14 [24];
  undefined1 auVar15 [24];
  uint7 uVar16;
  uint64_t hash_value;
  fio_ch_set__map_s_ *pfVar17;
  uintptr_t uVar18;
  fio_msg_internal_s *m_;
  fio_ch_set__ordered_s_ *pfVar19;
  uint32_t type;
  fio_engine_set__ordered_s_ *pfVar20;
  fio_lock_i ret;
  fio_str_info_s msg;
  timespec local_88;
  char *local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong *local_58;
  ulong local_50 [2];
  size_t sStack_40;
  char *local_38;
  
  if (s == (subscription_s *)0x0) {
    return;
  }
  LOCK();
  fVar4 = s->unsubscribed;
  s->unsubscribed = '\x01';
  UNLOCK();
  local_88.tv_sec = CONCAT71(local_88.tv_sec._1_7_,fVar4);
  if (fVar4 != '\0') goto LAB_0010c070;
  LOCK();
  fVar4 = s->lock;
  s->lock = '\x01';
  UNLOCK();
  if (fVar4 != '\0') {
    do {
      local_88.tv_sec = 0;
      local_88.tv_nsec = 1;
      nanosleep(&local_88,(timespec *)0x0);
      LOCK();
      fVar4 = s->lock;
      s->lock = '\x01';
      UNLOCK();
    } while (fVar4 != '\0');
  }
  pcVar5 = s->parent;
  LOCK();
  local_88.tv_sec._0_1_ = pcVar5->lock;
  pcVar5->lock = '\x01';
  UNLOCK();
  if ((fio_lock_i)local_88.tv_sec != '\0') {
    do {
      local_88.tv_sec = 0;
      local_88.tv_nsec = 1;
      nanosleep(&local_88,(timespec *)0x0);
      LOCK();
      fVar4 = pcVar5->lock;
      pcVar5->lock = '\x01';
      UNLOCK();
      local_88.tv_sec._0_1_ = fVar4;
    } while (fVar4 != '\0');
  }
  psVar6 = (subscription_s *)(s->node).next;
  if (psVar6 != s && psVar6 != (subscription_s *)0x0) {
    (psVar6->node).prev = (s->node).prev;
    ((s->node).prev)->next = (fio_ls_embd_s *)psVar6;
    (s->node).next = &s->node;
    (s->node).prev = &s->node;
  }
  if ((pcVar5->subscriptions).next == &pcVar5->subscriptions) {
    set = (anon_struct_264_5_f7cd9697 *)pcVar5->parent;
    hash_value = fio_siphash_xy(pcVar5->name,pcVar5->name_len,1,3,0x15bcc8,0x15bcc8);
    LOCK();
    pfVar1 = &(set->filters).lock;
    local_88.tv_sec._0_1_ = *pfVar1;
    *pfVar1 = '\x01';
    UNLOCK();
    if ((fio_lock_i)local_88.tv_sec != '\0') {
      do {
        local_88.tv_sec = 0;
        local_88.tv_nsec = 1;
        nanosleep(&local_88,(timespec *)0x0);
        LOCK();
        pfVar1 = &(set->filters).lock;
        fVar4 = *pfVar1;
        *pfVar1 = '\x01';
        UNLOCK();
        local_88.tv_sec._0_1_ = fVar4;
      } while (fVar4 != '\0');
    }
    if ((pcVar5->subscriptions).next != &pcVar5->subscriptions) {
      LOCK();
      (set->filters).lock = '\0';
      UNLOCK();
      LOCK();
      pcVar5->lock = '\0';
      UNLOCK();
      goto LAB_0010c057;
    }
    if (((hash_value != 0) &&
        (pfVar17 = fio_ch_set__find_map_pos_((fio_ch_set_s *)set,hash_value,pcVar5),
        pfVar17 != (fio_ch_set__map_s_ *)0x0)) && (pfVar17->pos != (fio_ch_set__ordered_s_ *)0x0)) {
      __ptr = pfVar17->pos->obj;
      if (__ptr != (channel_s *)0x0) {
        LOCK();
        psVar3 = &__ptr->ref;
        *psVar3 = *psVar3 - 1;
        UNLOCK();
        if (*psVar3 == 0) {
          free(__ptr);
        }
      }
      (set->filters).channels.count = (set->filters).channels.count - 1;
      pfVar7 = pfVar17->pos;
      pfVar7->hash = 0;
      uVar18 = (set->filters).channels.pos;
      pfVar19 = (set->filters).channels.ordered;
      if (pfVar7 == pfVar19 + (uVar18 - 1)) {
        pfVar17->hash = 0;
        pfVar19 = pfVar19 + (uVar18 - 2);
        do {
          if (uVar18 == 1) {
            uVar18 = 0;
            break;
          }
          uVar18 = uVar18 - 1;
          puVar2 = &pfVar19->hash;
          pfVar19 = pfVar19 + -1;
        } while (*puVar2 == 0);
        (set->filters).channels.pos = uVar18;
      }
      pfVar17->pos = (fio_ch_set__ordered_s_ *)0x0;
    }
    uVar16 = local_88.tv_sec._1_7_;
    LOCK();
    (set->filters).lock = '\0';
    UNLOCK();
    LOCK();
    pcVar5->lock = '\0';
    UNLOCK();
    local_88.tv_sec = (ulong)local_88.tv_sec._1_7_ << 8;
    if (set != &fio_postoffice) {
      LOCK();
      UNLOCK();
      local_88.tv_sec = CONCAT71(uVar16,fio_postoffice.engines.lock);
      if (fio_postoffice.engines.lock != '\0') {
        do {
          fio_postoffice.engines.lock = '\x01';
          local_88.tv_sec = 0;
          local_88.tv_nsec = 1;
          nanosleep(&local_88,(timespec *)0x0);
          LOCK();
          UNLOCK();
          local_88.tv_sec = CONCAT71(local_88.tv_sec._1_7_,fio_postoffice.engines.lock);
        } while (fio_postoffice.engines.lock != '\0');
      }
      fio_postoffice.engines.lock = '\x01';
      pfVar20 = fio_postoffice.engines.set.ordered;
      if (fio_postoffice.engines.set.ordered != (fio_engine_set__ordered_s_ *)0x0) {
        for (; pfVar20 < fio_postoffice.engines.set.ordered + fio_postoffice.engines.set.pos;
            pfVar20 = pfVar20 + 1) {
          if (pfVar20->hash != 0) {
            local_50[1] = 0;
            sStack_40 = pcVar5->name_len;
            local_38 = pcVar5->name;
            uVar9 = pcVar5->name_len;
            uVar10 = pcVar5->name;
            auVar13._8_8_ = uVar10;
            auVar13._0_8_ = uVar9;
            auVar13._16_8_ = 0;
            (*pfVar20->obj->unsubscribe)
                      (pfVar20->obj,(fio_str_info_s)(auVar13 << 0x40),pcVar5->match);
          }
        }
      }
      LOCK();
      fio_postoffice.engines.lock = '\0';
      UNLOCK();
      local_88.tv_sec = local_88.tv_sec & 0xffffffffffffff00;
      if (((fio_data->is_worker != '\0') && (fio_data->workers != 1)) && (cluster_data.uuid != 0)) {
        local_88.tv_sec = 0;
        local_88.tv_nsec = pcVar5->name_len;
        local_78 = pcVar5->name;
        uVar11 = pcVar5->name_len;
        uVar12 = pcVar5->name;
        auVar14._8_8_ = uVar12;
        auVar14._0_8_ = uVar11;
        local_58 = (ulong *)0x0;
        local_68 = 0;
        uStack_60 = 0;
        local_50[0] = 0;
        p_Var8 = pcVar5->match;
        if (p_Var8 == (fio_match_fn)0x0) {
          type = 5;
        }
        else {
          local_50[0] = (ulong)p_Var8 >> 0x38 | ((ulong)p_Var8 & 0xff000000000000) >> 0x28 |
                        ((ulong)p_Var8 & 0xff0000000000) >> 0x18 |
                        ((ulong)p_Var8 & 0xff00000000) >> 8 | ((ulong)p_Var8 & 0xff000000) << 8 |
                        ((ulong)p_Var8 & 0xff0000) << 0x18 | ((ulong)p_Var8 & 0xff00) << 0x28 |
                        (long)p_Var8 << 0x38;
          local_58 = local_50;
          uStack_60 = 8;
          type = 7;
        }
        auVar14._16_8_ = 0;
        auVar15._8_8_ = local_58;
        auVar15._0_8_ = uStack_60;
        auVar15._16_8_ = 0;
        m_ = fio_msg_internal_create
                       (0,type,(fio_str_info_s)(auVar14 << 0x40),(fio_str_info_s)(auVar15 << 0x40),
                        '\0','\x01');
        fio_cluster_client_sender(m_,-1);
      }
    }
  }
  else {
    LOCK();
    pcVar5->lock = '\0';
    UNLOCK();
LAB_0010c057:
    local_88.tv_sec = (ulong)local_88.tv_sec._1_7_ << 8;
  }
  s->on_message = (_func_void_fio_msg_s_ptr *)0x0;
  LOCK();
  fVar4 = s->lock;
  s->lock = '\0';
  UNLOCK();
  local_88.tv_sec = CONCAT71(local_88.tv_sec._1_7_,fVar4);
LAB_0010c070:
  LOCK();
  puVar2 = &s->ref;
  *puVar2 = *puVar2 - 1;
  UNLOCK();
  if (*puVar2 == 0) {
    if (s->on_unsubscribe != (_func_void_void_ptr_void_ptr *)0x0) {
      (*s->on_unsubscribe)(s->udata1,s->udata2);
    }
    pcVar5 = s->parent;
    if (pcVar5 != (channel_s *)0x0) {
      LOCK();
      psVar3 = &pcVar5->ref;
      *psVar3 = *psVar3 - 1;
      UNLOCK();
      if (*psVar3 == 0) {
        free(pcVar5);
      }
    }
    fio_free(s);
  }
  return;
}

Assistant:

void fio_unsubscribe(subscription_s *s) {
  if (!s)
    return;
  if (fio_trylock(&s->unsubscribed))
    goto finish;
  fio_lock(&s->lock);
  channel_s *ch = s->parent;
  uint8_t removed = 0;
  fio_lock(&ch->lock);
  fio_ls_embd_remove(&s->node);
  /* check if channel is done for */
  if (fio_ls_embd_is_empty(&ch->subscriptions)) {
    fio_collection_s *c = ch->parent;
    uint64_t hashed = FIO_HASH_FN(
        ch->name, ch->name_len, &fio_postoffice.pubsub, &fio_postoffice.pubsub);
    /* lock collection */
    fio_lock(&c->lock);
    /* test again within lock */
    if (fio_ls_embd_is_empty(&ch->subscriptions)) {
      fio_ch_set_remove(&c->channels, hashed, ch, NULL);
      removed = (c != &fio_postoffice.filters);
    }
    fio_unlock(&c->lock);
  }
  fio_unlock(&ch->lock);
  if (removed) {
    fio_pubsub_on_channel_destroy(ch);
  }

  /* promise the subscription will be inactive */
  s->on_message = NULL;
  fio_unlock(&s->lock);
finish:
  fio_subscription_free(s);
}